

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api.cpp
# Opt level: O0

RK_S32 vpu_api_decode(VpuCodecContext *ctx,VideoPacket_t *pkt,DecoderOut_t *aDecOut)

{
  VpuApiLegacy *api;
  DecoderOut_t *aDecOut_local;
  VideoPacket_t *pkt_local;
  VpuCodecContext *ctx_local;
  
  if (ctx == (VpuCodecContext *)0x0) {
    _mpp_log_l(4,"vpu_api","vpu_api_decode fail, input invalid",0);
    ctx_local._4_4_ = -1;
  }
  else if ((VpuApiLegacy *)ctx->vpuApiObj == (VpuApiLegacy *)0x0) {
    _mpp_log_l(4,"vpu_api","vpu_api_decode fail, vpu api invalid",0);
    ctx_local._4_4_ = -1;
  }
  else {
    ctx_local._4_4_ = VpuApiLegacy::decode((VpuApiLegacy *)ctx->vpuApiObj,ctx,pkt,aDecOut);
  }
  return ctx_local._4_4_;
}

Assistant:

static RK_S32
vpu_api_decode(VpuCodecContext *ctx, VideoPacket_t *pkt, DecoderOut_t *aDecOut)
{
    if (ctx == NULL) {
        mpp_log("vpu_api_decode fail, input invalid");
        return VPU_API_ERR_UNKNOW;
    }

    VpuApiLegacy* api = (VpuApiLegacy*)(ctx->vpuApiObj);
    if (api == NULL) {
        mpp_log("vpu_api_decode fail, vpu api invalid");
        return VPU_API_ERR_UNKNOW;
    }

    return api->decode(ctx, pkt, aDecOut);
}